

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::WriteAllBoards(BasePort *this)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  bool local_a1;
  bool local_71;
  uint local_70;
  bool ret_1;
  bool ret3;
  bool ret2;
  quadlet_t ctrl;
  bool ret;
  uint uStack_64;
  bool noneWrittenThisBoard;
  uint numQuads;
  uint numBytes;
  quadlet_t *buf;
  byte local_4e;
  byte local_4d;
  uint board;
  bool noneWritten;
  bool allOK;
  allocator<char> local_39;
  string local_38 [32];
  BasePort *local_18;
  BasePort *this_local;
  
  local_18 = this;
  uVar2 = (*this->_vptr_BasePort[0x11])();
  if ((uVar2 & 1) == 0) {
    poVar5 = std::operator<<(this->outStr,"BasePort::WriteAllBoards: port not initialized");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    (*this->_vptr_BasePort[9])();
    this_local._7_1_ = false;
  }
  else if ((this->Protocol_ == PROTOCOL_SEQ_R_BC_W) || (this->Protocol_ == PROTOCOL_BC_QRW)) {
    iVar3 = (*this->_vptr_BasePort[0x22])();
    this_local._7_1_ = (bool)((byte)iVar3 & 1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"WriteAllBoards",&local_39);
    iVar3 = (*this->_vptr_BasePort[0x1b])(this,local_38,(ulong)(this->autoReScan & 1));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
      this->rtWrite = true;
      local_4d = 1;
      local_4e = 1;
      for (buf._4_4_ = 0; buf._4_4_ < this->max_board; buf._4_4_ = buf._4_4_ + 1) {
        if (this->BoardList[buf._4_4_] != (BoardIO *)0x0) {
          puVar1 = this->WriteBufferBroadcast;
          uVar2 = (*this->_vptr_BasePort[0x17])();
          uVar4 = (*this->_vptr_BasePort[0x14])(this,2);
          _numQuads = puVar1 + (ulong)uVar4 + (ulong)uVar2;
          uStack_64 = (*this->BoardList[buf._4_4_]->_vptr_BoardIO[3])();
          ctrl = uStack_64 >> 2;
          if (this->FirmwareVersion[buf._4_4_] < 7) {
            (*this->BoardList[buf._4_4_]->_vptr_BoardIO[4])
                      (this->BoardList[buf._4_4_],_numQuads,0,(ulong)(ctrl - 1),1);
            ret2 = true;
            uVar2 = (*this->_vptr_BasePort[0x27])
                              (this,(ulong)(byte)buf._4_4_,0,_numQuads,(ulong)(uStack_64 - 4));
            ret3 = (bool)((byte)uVar2 & 1);
            if ((uVar2 & 1) == 0) {
              local_4d = 0;
            }
            else {
              local_4e = 0;
              ret2 = false;
            }
            (*this->BoardList[buf._4_4_]->_vptr_BoardIO[4])
                      (this->BoardList[buf._4_4_],&local_70,(ulong)(ctrl - 1),1,0);
            local_71 = true;
            if (local_70 != 0) {
              uVar2 = (*this->_vptr_BasePort[0x24])(this,(ulong)(byte)buf._4_4_,0,(ulong)local_70);
              local_71 = (bool)((byte)uVar2 & 1);
              if ((uVar2 & 1) == 0) {
                local_4d = 0;
              }
              else {
                local_4e = 0;
                ret2 = false;
              }
            }
            if ((((ret2 & 1U) != 0) ||
                (uVar2 = (*this->BoardList[buf._4_4_]->_vptr_BoardIO[6])(), (uVar2 & 1) == 0)) &&
               (uVar2 = (*this->_vptr_BasePort[0x25])(this,(ulong)(byte)buf._4_4_), (uVar2 & 1) != 0
               )) {
              local_4e = 0;
            }
            local_a1 = false;
            if ((ret3 & 1U) != 0) {
              local_a1 = local_71;
            }
            BoardIO::SetWriteValid(this->BoardList[buf._4_4_],local_a1);
            (*this->BoardList[buf._4_4_]->_vptr_BoardIO[5])();
          }
          else {
            (*this->BoardList[buf._4_4_]->_vptr_BoardIO[4])
                      (this->BoardList[buf._4_4_],_numQuads,0,(ulong)ctrl,1);
            uVar2 = (*this->_vptr_BasePort[0x27])
                              (this,(ulong)(byte)buf._4_4_,0,_numQuads,(ulong)uStack_64);
            BoardIO::SetWriteValid(this->BoardList[buf._4_4_],(bool)((byte)uVar2 & 1));
            (*this->BoardList[buf._4_4_]->_vptr_BoardIO[5])();
            if ((uVar2 & 1) == 0) {
              local_4d = 0;
            }
            else {
              local_4e = 0;
              (*this->BoardList[buf._4_4_]->_vptr_BoardIO[7])();
            }
          }
        }
      }
      if ((local_4e & 1) != 0) {
        (*this->_vptr_BasePort[9])();
      }
      if ((this->rtWrite & 1U) == 0) {
        poVar5 = std::operator<<(this->outStr,"BasePort::WriteAllBoards: rtWrite is false");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      this_local._7_1_ = (bool)(local_4d & 1);
    }
    else {
      (*this->_vptr_BasePort[9])();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BasePort::WriteAllBoards(void)
{
    if (!IsOK()) {
        outStr << "BasePort::WriteAllBoards: port not initialized" << std::endl;
        OnNoneWritten();
        return false;
    }

    if ((Protocol_ == BasePort::PROTOCOL_SEQ_R_BC_W) || (Protocol_ == BasePort::PROTOCOL_BC_QRW)) {
        return WriteAllBoardsBroadcast();
    }

    if (!CheckFwBusGeneration("WriteAllBoards", autoReScan)) {
        OnNoneWritten();
        return false;
    }

    rtWrite = true;   // for debugging
    bool allOK = true;
    bool noneWritten = true;
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            quadlet_t *buf = reinterpret_cast<quadlet_t *>(WriteBufferBroadcast + GetWriteQuadAlign() + GetPrefixOffset(WR_FW_BDATA));
            unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
            unsigned int numQuads = numBytes/sizeof(quadlet_t);
            if (FirmwareVersion[board] < 7) {
                // Rev 1-6 firmware: the last quadlet (Status/Control register)
                // is done as a separate quadlet write.
                BoardList[board]->GetWriteData(buf, 0, numQuads-1);
                bool noneWrittenThisBoard = true;
                bool ret = WriteBlock(board, 0, buf, numBytes-sizeof(quadlet_t));
                if (ret) { noneWritten = false; noneWrittenThisBoard = false; }
                else allOK = false;
                // Get last quadlet (false -> no byteswapping)
                quadlet_t ctrl;
                BoardList[board]->GetWriteData(&ctrl, numQuads-1, 1, false);
                bool ret2 = true;
                if (ctrl) {    // if anything non-zero, write it
                    ret2 = WriteQuadlet(board, 0, ctrl);
                    if (ret2) { noneWritten = false; noneWrittenThisBoard = false; }
                    else allOK = false;
                }
                if (noneWrittenThisBoard
                    || !(BoardList[board]->WriteBufferResetsWatchdog())) {
                    // send no-op to reset watchdog
                    bool ret3 = WriteNoOp(board);
                    if (ret3) noneWritten = false;
                }
                BoardList[board]->SetWriteValid(ret&&ret2);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
            }
            else {
                // Rev 7 firmware: write DAC (x4) and Status/Control register
                BoardList[board]->GetWriteData(buf, 0, numQuads);
                bool ret = WriteBlock(board, 0, buf, numBytes);
                BoardList[board]->SetWriteValid(ret);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
                if (ret) {
                    noneWritten = false;
                    // Check for data collection callback
                    BoardList[board]->CheckCollectCallback();
                }
                else {
                    allOK = false;
                }
            }
        }
    }
    if (noneWritten) {
        OnNoneWritten();
    }
    if (!rtWrite)
        outStr << "BasePort::WriteAllBoards: rtWrite is false" << std::endl;
    return allOK;
}